

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_config(unqlite *pDb,int nConfigOp,...)

{
  sxu32 sVar1;
  uint uVar2;
  jx9 *pjVar3;
  sxi32 sVar4;
  int iVar5;
  va_list ap;
  undefined8 *local_c8;
  uint *local_c0;
  
  if (pDb == (unqlite *)0x0) {
    return -0x18;
  }
  if (pDb->nMagic != 0xdb7c2712) {
    return -0x18;
  }
  iVar5 = -0xd;
  switch(nConfigOp) {
  case 1:
    if (local_c8 != (undefined8 *)0x0) {
      pjVar3 = (pDb->sDB).pJx9;
      sVar1 = (pjVar3->xConf).sErrConsumer.nByte;
      sVar4 = SyBlobAppend(&(pjVar3->xConf).sErrConsumer,"",1);
      if (sVar4 == 0) {
        (pjVar3->xConf).sErrConsumer.nByte = sVar1;
      }
      *local_c8 = (pjVar3->xConf).sErrConsumer.pBlob;
      if (local_c0 != (uint *)0x0) {
        uVar2 = (pjVar3->xConf).sErrConsumer.nByte;
        if (uVar2 < 2) {
          *local_c0 = 0;
          return 0;
        }
        *local_c0 = uVar2;
        return 0;
      }
      return 0;
    }
    break;
  case 2:
    if (0xff < (int)(sxu32)local_c8) {
      ((pDb->sDB).pPager)->nCacheMax = (sxu32)local_c8;
      return 0;
    }
    return -9;
  case 3:
    if (local_c8 != (undefined8 *)0x0) {
      sVar1 = (pDb->sErr).nByte;
      sVar4 = SyBlobAppend(&pDb->sErr,"",1);
      if (sVar4 == 0) {
        (pDb->sErr).nByte = sVar1;
      }
      *local_c8 = (pDb->sErr).pBlob;
      if (local_c0 != (uint *)0x0) {
        uVar2 = (pDb->sErr).nByte;
        if (uVar2 < 2) {
          *local_c0 = 0;
          return 0;
        }
        *local_c0 = uVar2;
        return 0;
      }
      return 0;
    }
    break;
  default:
    goto switchD_0010b6ee_caseD_4;
  case 5:
    *(byte *)&pDb->iFlags = (byte)pDb->iFlags | 1;
    return 0;
  case 6:
    iVar5 = 0;
    if (local_c8 != (undefined8 *)0x0) {
      *local_c8 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods->zName;
      iVar5 = 0;
    }
    goto switchD_0010b6ee_caseD_4;
  }
  iVar5 = -0x18;
switchD_0010b6ee_caseD_4:
  return iVar5;
}

Assistant:

int unqlite_config(unqlite *pDb,int nConfigOp,...)
{
	va_list ap;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 va_start(ap, nConfigOp);
	 rc = unqliteConfigure(&(*pDb),nConfigOp, ap);
	 va_end(ap);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}